

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O2

_Bool is_acceptable(automaton *a,char state)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar1 = strlen(a->acceptable_states);
  uVar3 = 0;
  uVar2 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar2 = uVar3;
  }
  do {
    uVar4 = uVar3;
    if (uVar2 == uVar4) break;
    uVar3 = uVar4 + 1;
  } while (a->acceptable_states[uVar4] != state);
  return (long)uVar4 < (long)(int)sVar1;
}

Assistant:

bool is_acceptable(const automaton * a, char state) {
    assert(state >= 0 + STR_STORAGE_VAL_OFFSET);
    assert(state < a->states_size + STR_STORAGE_VAL_OFFSET);

    size_t acceptable_states_length = strlen(a->acceptable_states);
    int i;
    for(i=0; i<(int)acceptable_states_length; i++) {
        if(a->acceptable_states[i] == state) {
            return true;
        }
    }
    assert(i == acceptable_states_length);
    return false;
}